

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint8_t uVar2;
  uint ciphersuite;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_transform *pmVar4;
  mbedtls_ssl_session *pmVar5;
  mbedtls_ssl_tls_prf_cb *pmVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uchar *key;
  mbedtls_ssl_mode_t mVar11;
  int iVar12;
  int iVar13;
  mbedtls_ssl_ciphersuite_t *suite;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *pmVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  uchar *buf;
  uchar *puVar18;
  uchar *buf_00;
  undefined4 uVar19;
  undefined8 uStack_178;
  uchar tmp [64];
  long local_40;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1981,"=> derive keys");
  pmVar3 = ssl->handshake;
  pmVar3->tls_prf = tls_prf_sha256;
  pmVar3->calc_verify = ssl_calc_verify_tls_sha256;
  pmVar3->calc_finished = ssl_calc_finished_tls_sha256;
  if (pmVar3->resume == '\0') {
    puVar1 = pmVar3->premaster;
    iVar12 = tls_prf_sha256(puVar1,pmVar3->pmslen,"master secret",pmVar3->randbytes,0x40,
                            ssl->session_negotiate->master,0x30);
    if (iVar12 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x196c,"prf",iVar12);
      pcVar16 = "ssl_compute_master";
      iVar13 = 0x1990;
      goto LAB_001d97b1;
    }
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1972,"premaster secret",puVar1,pmVar3->pmslen);
    mbedtls_platform_zeroize(puVar1,0x44);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x18e2,"no premaster (session resumed)");
  }
  pmVar3 = ssl->handshake;
  uStack_178 = *(undefined8 *)pmVar3->randbytes;
  tmp._0_8_ = *(undefined8 *)(pmVar3->randbytes + 8);
  tmp._8_8_ = *(undefined8 *)(pmVar3->randbytes + 0x10);
  tmp._16_8_ = *(undefined8 *)(pmVar3->randbytes + 0x18);
  tmp._24_8_ = *(undefined8 *)(pmVar3->randbytes + 0x20);
  tmp._32_8_ = *(undefined8 *)(pmVar3->randbytes + 0x28);
  tmp._40_8_ = *(undefined8 *)(pmVar3->randbytes + 0x30);
  tmp._48_8_ = *(undefined8 *)(pmVar3->randbytes + 0x38);
  uVar8 = *(undefined8 *)(pmVar3->randbytes + 0x28);
  uVar9 = *(undefined8 *)(pmVar3->randbytes + 0x30);
  uVar10 = *(undefined8 *)(pmVar3->randbytes + 0x38);
  *(undefined8 *)pmVar3->randbytes = *(undefined8 *)(pmVar3->randbytes + 0x20);
  *(undefined8 *)(pmVar3->randbytes + 8) = uVar8;
  *(undefined8 *)(pmVar3->randbytes + 0x10) = uVar9;
  *(undefined8 *)(pmVar3->randbytes + 0x18) = uVar10;
  pmVar3 = ssl->handshake;
  *(undefined8 *)(pmVar3->randbytes + 0x30) = tmp._8_8_;
  *(undefined8 *)(pmVar3->randbytes + 0x38) = tmp._16_8_;
  *(undefined8 *)(pmVar3->randbytes + 0x20) = uStack_178;
  *(undefined8 *)(pmVar3->randbytes + 0x28) = tmp._0_8_;
  mbedtls_platform_zeroize(&uStack_178,0x40);
  pmVar4 = ssl->transform_negotiate;
  pmVar5 = ssl->session_negotiate;
  ciphersuite = pmVar5->ciphersuite;
  pmVar3 = ssl->handshake;
  pmVar6 = pmVar3->tls_prf;
  uVar2 = ssl->conf->endpoint;
  pmVar4->tls_version = ssl->tls_version;
  suite = mbedtls_ssl_ciphersuite_from_id(ciphersuite);
  if (suite == (mbedtls_ssl_ciphersuite_t *)0x0) {
    pcVar16 = "ciphersuite info for %d not found";
    iVar12 = 0x1ff7;
    uVar17 = (ulong)ciphersuite;
LAB_001d978b:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,iVar12,pcVar16,uVar17);
    iVar12 = -0x7100;
  }
  else {
    mVar11 = mbedtls_ssl_get_mode_from_ciphersuite(suite);
    if (mVar11 == MBEDTLS_SSL_MODE_AEAD) {
      pmVar4->taglen = (ulong)((suite->flags & 2) == 0) * 8 + 8;
    }
    cipher_info = mbedtls_cipher_info_from_type((uint)suite->cipher);
    if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
      uVar17 = (ulong)suite->cipher;
      pcVar16 = "cipher info for %u not found";
      iVar12 = 0x2014;
      goto LAB_001d978b;
    }
    pmVar14 = mbedtls_md_info_from_type((uint)suite->mac);
    if (pmVar14 == (mbedtls_md_info_t *)0x0) {
      uVar17 = (ulong)suite->mac;
      pcVar16 = "mbedtls_md info for %u not found";
      iVar12 = 0x2024;
      goto LAB_001d978b;
    }
    buf = pmVar5->master;
    puVar1 = pmVar3->randbytes;
    iVar12 = (*pmVar6)(buf,0x30,"key expansion",puVar1,0x40,(uchar *)&uStack_178,0x100);
    if (iVar12 == 0) {
      pcVar16 = mbedtls_ssl_get_ciphersuite_name(ciphersuite);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x2046,"ciphersuite = %s",pcVar16);
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x2047,"master secret",buf,0x30);
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x2048,"random bytes",puVar1,0x40);
      uVar19 = 0;
      buf_00 = (uchar *)&uStack_178;
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x2049,"key block",buf_00,0x100);
      if (mVar11 == MBEDTLS_SSL_MODE_AEAD) {
        uVar17 = (ulong)(*(uint *)&cipher_info->field_0x8 >> 5 & 0x78);
        pmVar4->maclen = 0;
        pmVar4->ivlen = 0xc;
        sVar15 = (ulong)((*(uint *)&cipher_info->field_0x8 & 0xf000) == 0xb000) * 8 + 4;
        pmVar4->fixed_ivlen = sVar15;
        sVar15 = (pmVar4->taglen - sVar15) + 0xc;
        pmVar4->minlen = sVar15;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x20c5,"keylen: %u, minlen: %u, ivlen: %u, maclen: %u",uVar17,
                   CONCAT44(uVar19,(int)sVar15),0xc,0);
        if (uVar2 == '\0') {
          buf_00 = tmp + (uVar17 - 8);
          sVar15 = pmVar4->fixed_ivlen;
          local_40 = 0x38;
          lVar7 = 0x28;
          puVar18 = buf_00;
          key = (uchar *)&uStack_178;
joined_r0x001d9991:
          if (sVar15 == 0) {
            sVar15 = pmVar4->ivlen;
          }
          memcpy(pmVar4->iv_enc + lVar7 + -0x28,puVar18 + uVar17,sVar15);
          memcpy(pmVar4->iv_enc + local_40 + -0x28,puVar18 + uVar17 + sVar15,sVar15);
          if (ssl->f_export_keys != (mbedtls_ssl_export_keys_t *)0x0) {
            (*ssl->f_export_keys)
                      (ssl->p_export_keys,MBEDTLS_SSL_KEY_EXPORT_TLS12_MASTER_SECRET,buf,0x30,
                       pmVar3->randbytes + 0x20,puVar1,SUB14(pmVar6 == tls_prf_sha256,0) * 2);
          }
          iVar12 = mbedtls_cipher_setup(&pmVar4->cipher_ctx_enc,cipher_info);
          if (iVar12 == 0) {
            iVar12 = mbedtls_cipher_setup(&pmVar4->cipher_ctx_dec,cipher_info);
            if (iVar12 == 0) {
              iVar12 = mbedtls_cipher_setkey
                                 (&pmVar4->cipher_ctx_enc,key,
                                  *(uint *)&cipher_info->field_0x8 >> 2 & 0x3c0,MBEDTLS_ENCRYPT);
              if (iVar12 == 0) {
                iVar13 = mbedtls_cipher_setkey
                                   (&pmVar4->cipher_ctx_dec,buf_00,
                                    *(uint *)&cipher_info->field_0x8 >> 2 & 0x3c0,MBEDTLS_DECRYPT);
                iVar12 = 0;
                if (iVar13 != 0) {
                  mbedtls_debug_print_ret
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                             ,0x212b,"mbedtls_cipher_setkey",iVar13);
                  iVar12 = iVar13;
                }
                goto LAB_001d9af6;
              }
              pcVar16 = "mbedtls_cipher_setkey";
              iVar13 = 0x2124;
            }
            else {
              pcVar16 = "mbedtls_cipher_setup";
              iVar13 = 0x211d;
            }
          }
          else {
            pcVar16 = "mbedtls_cipher_setup";
            iVar13 = 0x2117;
          }
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,iVar13,pcVar16,iVar12);
        }
        else {
          if (uVar2 == '\x01') {
            puVar18 = tmp + (uVar17 - 8);
            sVar15 = pmVar4->fixed_ivlen;
            local_40 = 0x28;
            lVar7 = 0x38;
            key = puVar18;
            goto joined_r0x001d9991;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x20e9,"should never happen");
          iVar12 = -0x6c00;
        }
LAB_001d9af6:
        mbedtls_platform_zeroize(&uStack_178,0x100);
        if (iVar12 == 0) {
          mbedtls_platform_zeroize(ssl->handshake->randbytes,0x40);
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x19b4,"<= derive keys");
          return 0;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x20bd,"should never happen");
        iVar12 = -0x6c00;
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x2041,"prf",iVar12);
    }
  }
  pcVar16 = "ssl_tls12_populate_transform";
  iVar13 = 0x19ac;
LAB_001d97b1:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,iVar13,pcVar16,iVar12);
  return iVar12;
}

Assistant:

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_ssl_ciphersuite_t * const ciphersuite_info =
        ssl->handshake->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> derive keys"));

    /* Set PRF, calc_verify and calc_finished function pointers */
    ret = ssl_set_handshake_prfs(ssl->handshake,
                                 (mbedtls_md_type_t) ciphersuite_info->mac);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_set_handshake_prfs", ret);
        return ret;
    }

    /* Compute master secret if needed */
    ret = ssl_compute_master(ssl->handshake,
                             ssl->session_negotiate->master,
                             ssl);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_compute_master", ret);
        return ret;
    }

    /* Swap the client and server random values:
     * - MS derivation wanted client+server (RFC 5246 8.1)
     * - key derivation wants server+client (RFC 5246 6.3) */
    {
        unsigned char tmp[64];
        memcpy(tmp, ssl->handshake->randbytes, 64);
        memcpy(ssl->handshake->randbytes, tmp + 32, 32);
        memcpy(ssl->handshake->randbytes + 32, tmp, 32);
        mbedtls_platform_zeroize(tmp, sizeof(tmp));
    }

    /* Populate transform structure */
    ret = ssl_tls12_populate_transform(ssl->transform_negotiate,
                                       ssl->session_negotiate->ciphersuite,
                                       ssl->session_negotiate->master,
#if defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
                                       ssl->session_negotiate->encrypt_then_mac,
#endif /* MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM */
                                       ssl->handshake->tls_prf,
                                       ssl->handshake->randbytes,
                                       ssl->tls_version,
                                       ssl->conf->endpoint,
                                       ssl);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_tls12_populate_transform", ret);
        return ret;
    }

    /* We no longer need Server/ClientHello.random values */
    mbedtls_platform_zeroize(ssl->handshake->randbytes,
                             sizeof(ssl->handshake->randbytes));

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= derive keys"));

    return 0;
}